

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

uint aom_highbd_10_masked_sub_pixel_variance64x16_ssse3
               (uint8_t *src8,int src_stride,int xoffset,int yoffset,uint8_t *ref8,int ref_stride,
               uint8_t *second_pred8,uint8_t *msk,int msk_stride,int invert_mask,uint32_t *sse)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint16_t *a_ptr;
  uint16_t *b_ptr;
  int local_8c4;
  uint64_t sse64;
  uint16_t temp [1088];
  
  b_ptr = (uint16_t *)((long)second_pred8 * 2);
  highbd_bilinear_filter((uint16_t *)((long)src8 * 2),src_stride,xoffset,yoffset,temp,0x40,0x10);
  if (invert_mask == 0) {
    a_ptr = temp;
  }
  else {
    a_ptr = b_ptr;
    b_ptr = temp;
  }
  highbd_masked_variance
            ((uint16_t *)((long)ref8 * 2),ref_stride,a_ptr,0x40,b_ptr,0x40,msk,msk_stride,0x40,0x10,
             &sse64,&local_8c4);
  uVar2 = sse64 + 8 >> 4;
  *sse = (uint32_t)uVar2;
  lVar3 = (long)(local_8c4 + 2 >> 2);
  lVar3 = (uVar2 & 0xffffffff) - ((ulong)(lVar3 * lVar3) >> 10);
  uVar1 = (uint)lVar3;
  if (lVar3 < 0) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static inline __m128i highbd_filter_block(const __m128i a, const __m128i b,
                                          const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi16(a, b);
  v0 = _mm_madd_epi16(v0, filter);
  v0 = xx_roundn_epu32(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi16(a, b);
  v1 = _mm_madd_epi16(v1, filter);
  v1 = xx_roundn_epu32(v1, FILTER_BITS);

  return _mm_packs_epi32(v0, v1);
}